

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

bool __thiscall ftxui::WideInputBase::OnMouseEvent(WideInputBase *this,Event *event)

{
  int iVar1;
  bool bVar2;
  Mouse *pMVar3;
  int *piVar4;
  InputOption *this_00;
  int local_34 [3];
  int new_cursor_position;
  Event *local_20;
  Event *event_local;
  WideInputBase *this_local;
  
  local_20 = event;
  event_local = (Event *)this;
  ComponentBase::CaptureMouse((ComponentBase *)&stack0xffffffffffffffd8,(Event *)this);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffd8);
  std::
  unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>::
  ~unique_ptr((unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
               *)&stack0xffffffffffffffd8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pMVar3 = Event::mouse(event);
    iVar1 = pMVar3->x;
    pMVar3 = Event::mouse(event);
    bVar2 = Box::Contain(&this->input_box_,iVar1,pMVar3->y);
    if (bVar2) {
      ComponentBase::TakeFocus(&this->super_ComponentBase);
      pMVar3 = Event::mouse(event);
      if ((pMVar3->button == Left) && (pMVar3 = Event::mouse(event), pMVar3->motion == Pressed)) {
        piVar4 = cursor_position(this);
        iVar1 = *piVar4;
        pMVar3 = Event::mouse(event);
        local_34[2] = (iVar1 + pMVar3->x) - (this->cursor_box_).x_min;
        local_34[1] = 0;
        WideStringRef::operator->[abi_cxx11_(&this->content_);
        local_34[0] = std::__cxx11::wstring::size();
        piVar4 = std::min<int>(local_34,local_34 + 2);
        piVar4 = std::max<int>(local_34 + 1,piVar4);
        local_34[2] = *piVar4;
        piVar4 = cursor_position(this);
        iVar1 = local_34[2];
        if (*piVar4 != local_34[2]) {
          piVar4 = cursor_position(this);
          *piVar4 = iVar1;
          this_00 = Ref<ftxui::InputOption>::operator->(&this->option_);
          std::function<void_()>::operator()(&this_00->on_change);
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool OnMouseEvent(Event event) {
    if (!CaptureMouse(event))
      return false;
    if (!input_box_.Contain(event.mouse().x, event.mouse().y))
      return false;

    TakeFocus();

    if (event.mouse().button == Mouse::Left &&
        event.mouse().motion == Mouse::Pressed) {
      int new_cursor_position =
          cursor_position() + event.mouse().x - cursor_box_.x_min;
      new_cursor_position =
          std::max(0, std::min<int>(content_->size(), new_cursor_position));
      if (cursor_position() != new_cursor_position) {
        cursor_position() = new_cursor_position;
        option_->on_change();
      }
    }
    return true;
  }